

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CESkyCoord * __thiscall CEPlanet::ObservedCoords(CEPlanet *this,CEDate *date,CEObserver *observer)

{
  reference pvVar1;
  CEAngle *in_RSI;
  CEObserver *in_RDI;
  CEObserver *in_stack_00000010;
  CEDate *in_stack_00000018;
  CESkyCoordType *in_stack_00000020;
  CESkyCoord *in_stack_00000028;
  CESkyCoord coord;
  CESkyCoordType coordsys;
  double dec;
  double ra;
  int i;
  CEPlanet *in_stack_000000a8;
  vector<double,_std::allocator<double>_> pos_obs;
  vector<double,_std::allocator<double>_> offset;
  double *in_stack_fffffffffffffef8;
  CEPlanet *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  CEObserver *this_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  CESkyCoord *in_stack_ffffffffffffff30;
  undefined8 local_78;
  undefined8 local_70;
  int local_68;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  double local_28;
  
  this_00 = in_RDI;
  local_28 = CEDate::operator_cast_to_double((CEDate *)0x13d45e);
  UpdatePosition(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  CEObserver::PositionICRS(this_00,(CEDate *)in_RDI);
  PositionICRS_Obs(in_stack_000000a8,_i);
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_68);
    in_stack_ffffffffffffff00 = (CEPlanet *)*pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_68);
    in_stack_ffffffffffffff08 = (double *)((double)in_stack_ffffffffffffff00 - *pvVar1);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_68);
    *pvVar1 = (value_type)in_stack_ffffffffffffff08;
  }
  local_70 = 0;
  local_78 = 0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
  iauC2s(pvVar1,&local_70,&local_78);
  CEAngle::CEAngle((CEAngle *)in_RDI,in_stack_ffffffffffffff08);
  CEAngle::CEAngle((CEAngle *)in_RDI,in_stack_ffffffffffffff08);
  CESkyCoord::CESkyCoord
            (in_stack_ffffffffffffff30,
             (CEAngle *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),in_RSI,
             (CESkyCoordType *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x13d63b);
  CEAngle::~CEAngle((CEAngle *)0x13d645);
  CESkyCoord::ConvertTo(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_ffffffffffffff00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  return (CESkyCoord *)this_00;
}

Assistant:

CESkyCoord CEPlanet::ObservedCoords(const CEDate&     date,
                                    const CEObserver& observer) const
{
    // Update planet position
    UpdatePosition(date);

    // Get the observer ICRS position on a given date and the time-delayed
    // position of the planet on that date
    std::vector<double> offset  = observer.PositionICRS(date);
    std::vector<double> pos_obs = PositionICRS_Obs(date);

    // Compute the difference in coordinates
    for (int i=0; i<3; i++)
        offset[i] = pos_obs[i] - offset[i];

    // Convert the offset into RA,Dec
    double ra(0.0);
    double dec(0.0);
    iauC2s(&offset[0], &ra, &dec);

    // Note that the coordinate system depends on the planet
    CESkyCoordType coordsys = CESkyCoordType::ICRS;
    if (sofa_planet_id_ == 3.5) {
        coordsys = CESkyCoordType::CIRS;
    }
    CESkyCoord coord(ra, dec, coordsys);
    
    return coord.ConvertTo(CESkyCoordType::OBSERVED, date, observer);
}